

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                      void *aad,size_t aadlen)

{
  int iVar1;
  ptls_fusion_aesgcm_context_t *ppVar2;
  __m128i ctr;
  size_t enclen;
  aesgcm_context *ctx;
  void *aad_local;
  uint64_t seq_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_aead_context_t *_ctx_local;
  
  if (inlen < 0x10) {
    _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
  }
  else {
    _ctx_local = (ptls_aead_context_t *)(inlen - 0x10);
    if (_ctx[1].algo[4].setup_crypto <
        (_func_int_ptls_aead_context_t_ptr_int_void_ptr_void_ptr *)
        ((long)&_ctx_local->algo + aadlen)) {
      ppVar2 = ptls_fusion_aesgcm_set_capacity
                         ((ptls_fusion_aesgcm_context_t *)_ctx[1].algo,
                          (long)&_ctx_local->algo + aadlen);
      _ctx[1].algo = (st_ptls_aead_algorithm_t *)ppVar2;
    }
    ppVar2 = (ptls_fusion_aesgcm_context_t *)_ctx[1].algo;
    calc_counter((aesgcm_context *)_ctx,seq);
    ctr[1] = aadlen;
    ctr[0] = (longlong)aad;
    iVar1 = ptls_fusion_aesgcm_decrypt
                      (ppVar2,output,input,(size_t)_ctx_local,ctr,
                       (void *)((long)input + (long)_ctx_local),(size_t)ppVar2,output);
    if (iVar1 == 0) {
      _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
    }
  }
  return (size_t)_ctx_local;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                              const void *aad, size_t aadlen)
{
    struct aesgcm_context *ctx = (void *)_ctx;

    if (inlen < 16)
        return SIZE_MAX;

    size_t enclen = inlen - 16;
    if (enclen + aadlen > ctx->aesgcm->capacity)
        ctx->aesgcm = ptls_fusion_aesgcm_set_capacity(ctx->aesgcm, enclen + aadlen);
    if (!ptls_fusion_aesgcm_decrypt(ctx->aesgcm, output, input, enclen, calc_counter(ctx, seq), aad, aadlen,
                                    (const uint8_t *)input + enclen))
        return SIZE_MAX;
    return enclen;
}